

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmGraphicsShaderTestUtil.cpp
# Opt level: O0

string * vkt::SpirVAssembly::makeGeometryShaderAssembly
                   (string *__return_storage_ptr__,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *fragments)

{
  allocator<char> local_59;
  string local_58;
  StringTemplate local_38;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_18;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *fragments_local;
  
  local_18 = fragments;
  fragments_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,
             "OpCapability Geometry\nOpCapability ClipDistance\nOpCapability CullDistance\nOpMemoryModel Logical GLSL450\nOpEntryPoint Geometry %BP_main \"main\" %BP_out_gl_position %BP_gl_in %BP_out_color %BP_in_color\nOpExecutionMode %BP_main Triangles\nOpExecutionMode %BP_main OutputTriangleStrip\nOpExecutionMode %BP_main OutputVertices 3\n${debug:opt}\nOpName %BP_main \"main\"\nOpName %BP_per_vertex_in \"gl_PerVertex\"\nOpMemberName %BP_per_vertex_in 0 \"gl_Position\"\nOpMemberName %BP_per_vertex_in 1 \"gl_PointSize\"\nOpMemberName %BP_per_vertex_in 2 \"gl_ClipDistance\"\nOpMemberName %BP_per_vertex_in 3 \"gl_CullDistance\"\nOpName %BP_gl_in \"gl_in\"\nOpName %BP_out_color \"out_color\"\nOpName %BP_in_color \"in_color\"\nOpName %test_code \"testfun(vf4;\"\nOpDecorate %BP_out_gl_position BuiltIn Position\nOpMemberDecorate %BP_per_vertex_in 0 BuiltIn Position\nOpMemberDecorate %BP_per_vertex_in 1 BuiltIn PointSize\nOpMemberDecorate %BP_per_vertex_in 2 BuiltIn ClipDistance\nOpMemberDecorate %BP_per_vertex_in 3 BuiltIn CullDistance\nOpDecorate %BP_per_vertex_in Block\nOpDecorate %BP_out_color Location 1\nOpDecorate %BP_in_color Location 1\n${decoration:opt}\n%void = OpTypeVoid\n%bool = OpTypeBool\n%i32 = OpTypeInt 32 1\n%u32 = OpTypeInt 32 0\n%f32 = OpTypeFloat 32\n%v3f32 = OpTypeVector %f32 3\n%v4i32 = OpTypeVector %i32 4\n%v4f32 = OpTypeVector %f32 4\n%v4bool = OpTypeVector %bool 4\n%v4f32_function = OpTypeFunction %v4f32 %v4f32\n%fun = OpTypeFunction %void\n%ip_f32 = OpTypePointer Input %f32\n%ip_i32 = OpTypePointer Input %i32\n%ip_v3f32 = OpTypePointer Input %v3f32\n%ip_v4f32 = OpTypePointer Input %v4f32\n%op_f32 = OpTypePointer Output %f32\n%op_v4f32 = OpTypePointer Output %v4f32\n%fp_f32   = OpTypePointer Function %f32\n%fp_i32   = OpTypePointer Function %i32\n%fp_v4f32 = OpTypePointer Function %v4f32\n%c_f32_1 = OpConstant %f32 1.0\n%c_f32_0 = OpConstant %f32 0.0\n%c_f32_0_5 = OpConstant %f32 0.5\n%c_f32_n1  = OpConstant %f32 -1.\n%c_f32_7 = OpConstant %f32 7.0\n%c_f32_8 = OpConstant %f32 8.0\n%c_i32_0 = OpConstant %i32 0\n%c_i32_1 = OpConstant %i32 1\n%c_i32_2 = OpConstant %i32 2\n%c_i32_3 = OpCo..." /* TRUNCATED STRING LITERAL */
             ,&local_59);
  tcu::StringTemplate::StringTemplate(&local_38,&local_58);
  tcu::StringTemplate::specialize(__return_storage_ptr__,&local_38,local_18);
  tcu::StringTemplate::~StringTemplate(&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  return __return_storage_ptr__;
}

Assistant:

string makeGeometryShaderAssembly(const map<string, string>& fragments)
{
	static const char geometryShaderBoilerplate[] =
		"OpCapability Geometry\n"
		"OpCapability ClipDistance\n"
		"OpCapability CullDistance\n"
		"OpMemoryModel Logical GLSL450\n"
		"OpEntryPoint Geometry %BP_main \"main\" %BP_out_gl_position %BP_gl_in %BP_out_color %BP_in_color\n"
		"OpExecutionMode %BP_main Triangles\n"
		"OpExecutionMode %BP_main OutputTriangleStrip\n"
		"OpExecutionMode %BP_main OutputVertices 3\n"
		"${debug:opt}\n"
		"OpName %BP_main \"main\"\n"
		"OpName %BP_per_vertex_in \"gl_PerVertex\"\n"
		"OpMemberName %BP_per_vertex_in 0 \"gl_Position\"\n"
		"OpMemberName %BP_per_vertex_in 1 \"gl_PointSize\"\n"
		"OpMemberName %BP_per_vertex_in 2 \"gl_ClipDistance\"\n"
		"OpMemberName %BP_per_vertex_in 3 \"gl_CullDistance\"\n"
		"OpName %BP_gl_in \"gl_in\"\n"
		"OpName %BP_out_color \"out_color\"\n"
		"OpName %BP_in_color \"in_color\"\n"
		"OpName %test_code \"testfun(vf4;\"\n"
		"OpDecorate %BP_out_gl_position BuiltIn Position\n"
		"OpMemberDecorate %BP_per_vertex_in 0 BuiltIn Position\n"
		"OpMemberDecorate %BP_per_vertex_in 1 BuiltIn PointSize\n"
		"OpMemberDecorate %BP_per_vertex_in 2 BuiltIn ClipDistance\n"
		"OpMemberDecorate %BP_per_vertex_in 3 BuiltIn CullDistance\n"
		"OpDecorate %BP_per_vertex_in Block\n"
		"OpDecorate %BP_out_color Location 1\n"
		"OpDecorate %BP_in_color Location 1\n"
		"${decoration:opt}\n"
		SPIRV_ASSEMBLY_TYPES
		SPIRV_ASSEMBLY_CONSTANTS
		SPIRV_ASSEMBLY_ARRAYS
		"%BP_per_vertex_in = OpTypeStruct %v4f32 %f32 %a1f32 %a1f32\n"
		"%BP_a3_per_vertex_in = OpTypeArray %BP_per_vertex_in %c_u32_3\n"
		"%BP_ip_a3_per_vertex_in = OpTypePointer Input %BP_a3_per_vertex_in\n"

		"%BP_gl_in = OpVariable %BP_ip_a3_per_vertex_in Input\n"
		"%BP_out_color = OpVariable %op_v4f32 Output\n"
		"%BP_in_color = OpVariable %ip_a3v4f32 Input\n"
		"%BP_out_gl_position = OpVariable %op_v4f32 Output\n"
		"${pre_main:opt}\n"

		"%BP_main = OpFunction %void None %fun\n"
		"%BP_label = OpLabel\n"
		"%BP_gl_in_0_gl_position = OpAccessChain %ip_v4f32 %BP_gl_in %c_i32_0 %c_i32_0\n"
		"%BP_gl_in_1_gl_position = OpAccessChain %ip_v4f32 %BP_gl_in %c_i32_1 %c_i32_0\n"
		"%BP_gl_in_2_gl_position = OpAccessChain %ip_v4f32 %BP_gl_in %c_i32_2 %c_i32_0\n"

		"%BP_in_position_0 = OpLoad %v4f32 %BP_gl_in_0_gl_position\n"
		"%BP_in_position_1 = OpLoad %v4f32 %BP_gl_in_1_gl_position\n"
		"%BP_in_position_2 = OpLoad %v4f32 %BP_gl_in_2_gl_position \n"

		"%BP_in_color_0_ptr = OpAccessChain %ip_v4f32 %BP_in_color %c_i32_0\n"
		"%BP_in_color_1_ptr = OpAccessChain %ip_v4f32 %BP_in_color %c_i32_1\n"
		"%BP_in_color_2_ptr = OpAccessChain %ip_v4f32 %BP_in_color %c_i32_2\n"

		"%BP_in_color_0 = OpLoad %v4f32 %BP_in_color_0_ptr\n"
		"%BP_in_color_1 = OpLoad %v4f32 %BP_in_color_1_ptr\n"
		"%BP_in_color_2 = OpLoad %v4f32 %BP_in_color_2_ptr\n"

		"%BP_transformed_in_color_0 = OpFunctionCall %v4f32 %test_code %BP_in_color_0\n"
		"%BP_transformed_in_color_1 = OpFunctionCall %v4f32 %test_code %BP_in_color_1\n"
		"%BP_transformed_in_color_2 = OpFunctionCall %v4f32 %test_code %BP_in_color_2\n"


		"OpStore %BP_out_gl_position %BP_in_position_0\n"
		"OpStore %BP_out_color %BP_transformed_in_color_0\n"
		"OpEmitVertex\n"

		"OpStore %BP_out_gl_position %BP_in_position_1\n"
		"OpStore %BP_out_color %BP_transformed_in_color_1\n"
		"OpEmitVertex\n"

		"OpStore %BP_out_gl_position %BP_in_position_2\n"
		"OpStore %BP_out_color %BP_transformed_in_color_2\n"
		"OpEmitVertex\n"

		"OpEndPrimitive\n"
		"OpReturn\n"
		"OpFunctionEnd\n"
		"${testfun}\n";
	return tcu::StringTemplate(geometryShaderBoilerplate).specialize(fragments);
}